

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O1

DdNode ** Aig_ManCreateOutputs(DdManager *dd,Aig_Man_t *p)

{
  int iVar1;
  DdNode *n;
  DdNode **ppDVar2;
  long lVar3;
  
  iVar1 = p->nTruePos;
  ppDVar2 = (DdNode **)malloc((long)iVar1 * 8);
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if (p->vCos->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      n = *(DdNode **)((long)p->vCos->pArray[lVar3] + 0x28);
      ppDVar2[lVar3] = n;
      Cudd_Ref(n);
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nTruePos);
  }
  return ppDVar2;
}

Assistant:

DdNode ** Aig_ManCreateOutputs( DdManager * dd, Aig_Man_t * p )
{
    DdNode ** pbOutputs;
    Aig_Obj_t * pNode;
    int i;
    // compute the transition relation
    pbOutputs = ABC_ALLOC( DdNode *, Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pNode, i )
    {
        pbOutputs[i] = Aig_ObjGlobalBdd(pNode);  Cudd_Ref( pbOutputs[i] );
    }
    return pbOutputs;
}